

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O0

int ssl_pick_cert(mbedtls_ssl_context *ssl,mbedtls_ssl_ciphersuite_t *ciphersuite_info)

{
  int iVar1;
  int key_type_matches;
  int pk_alg_is_none;
  uint32_t flags;
  mbedtls_pk_type_t pk_alg;
  mbedtls_ssl_key_cert *list;
  mbedtls_ssl_key_cert *cur;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info_local;
  mbedtls_ssl_context *ssl_local;
  
  cur = (mbedtls_ssl_key_cert *)ciphersuite_info;
  ciphersuite_info_local = (mbedtls_ssl_ciphersuite_t *)ssl;
  pk_alg_is_none = mbedtls_ssl_get_ciphersuite_sig_pk_alg(ciphersuite_info);
  _flags = *(mbedtls_ssl_key_cert **)(*(long *)ciphersuite_info_local + 0x90);
  if (pk_alg_is_none == MBEDTLS_PK_NONE) {
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_msg
              ((mbedtls_ssl_context *)ciphersuite_info_local,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0x2cf,"ciphersuite requires certificate");
    if (_flags == (mbedtls_ssl_key_cert *)0x0) {
      mbedtls_debug_print_msg
                ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                 ,0x2d2,"server has no certificate");
      ssl_local._4_4_ = -1;
    }
    else {
      for (list = _flags; list != (mbedtls_ssl_key_cert *)0x0; list = list->next) {
        key_type_matches = 0;
        mbedtls_debug_print_crt
                  ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0x2d9,"candidate certificate chain, certificate",list->cert);
        iVar1 = mbedtls_pk_can_do(&list->cert->pk,pk_alg_is_none);
        if (iVar1 == 0) {
          mbedtls_debug_print_msg
                    ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                     ,0x2ea,"certificate mismatch: key type");
        }
        else {
          iVar1 = mbedtls_ssl_check_cert_usage
                            (list->cert,(mbedtls_ssl_ciphersuite_t *)cur,1,
                             (uint32_t *)&key_type_matches);
          if (iVar1 == 0) {
            if ((pk_alg_is_none != 4) ||
               (iVar1 = ssl_check_key_curve(&list->cert->pk,
                                            *(uint16_t **)(ciphersuite_info_local[4].name + 0x3c0)),
               iVar1 == 0)) break;
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                       ,0x301,"certificate mismatch: elliptic curve");
          }
          else {
            mbedtls_debug_print_msg
                      ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                       ,0x2f9,"certificate mismatch: (extended) key usage extension");
          }
        }
      }
      if (list == (mbedtls_ssl_key_cert *)0x0) {
        ssl_local._4_4_ = -1;
      }
      else {
        *(mbedtls_ssl_key_cert **)(ciphersuite_info_local[4].name + 0x3e0) = list;
        mbedtls_debug_print_crt
                  ((mbedtls_ssl_context *)ciphersuite_info_local,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
                   ,0x30e,"selected certificate chain, certificate",
                   (mbedtls_x509_crt *)**(undefined8 **)(ciphersuite_info_local[4].name + 0x3e0));
        ssl_local._4_4_ = 0;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_pick_cert(mbedtls_ssl_context *ssl,
                         const mbedtls_ssl_ciphersuite_t *ciphersuite_info)
{
    mbedtls_ssl_key_cert *cur, *list;
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_algorithm_t pk_alg =
        mbedtls_ssl_get_ciphersuite_sig_pk_psa_alg(ciphersuite_info);
    psa_key_usage_t pk_usage =
        mbedtls_ssl_get_ciphersuite_sig_pk_psa_usage(ciphersuite_info);
#else
    mbedtls_pk_type_t pk_alg =
        mbedtls_ssl_get_ciphersuite_sig_pk_alg(ciphersuite_info);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
    uint32_t flags;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if (ssl->handshake->sni_key_cert != NULL) {
        list = ssl->handshake->sni_key_cert;
    } else
#endif
    list = ssl->conf->key_cert;

    int pk_alg_is_none = 0;
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    pk_alg_is_none = (pk_alg == PSA_ALG_NONE);
#else
    pk_alg_is_none = (pk_alg == MBEDTLS_PK_NONE);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
    if (pk_alg_is_none) {
        return 0;
    }

    MBEDTLS_SSL_DEBUG_MSG(3, ("ciphersuite requires certificate"));

    if (list == NULL) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("server has no certificate"));
        return -1;
    }

    for (cur = list; cur != NULL; cur = cur->next) {
        flags = 0;
        MBEDTLS_SSL_DEBUG_CRT(3, "candidate certificate chain, certificate",
                              cur->cert);

        int key_type_matches = 0;
#if defined(MBEDTLS_USE_PSA_CRYPTO)
#if defined(MBEDTLS_SSL_ASYNC_PRIVATE)
        key_type_matches = ((ssl->conf->f_async_sign_start != NULL ||
                             ssl->conf->f_async_decrypt_start != NULL ||
                             mbedtls_pk_can_do_ext(cur->key, pk_alg, pk_usage)) &&
                            mbedtls_pk_can_do_ext(&cur->cert->pk, pk_alg, pk_usage));
#else
        key_type_matches = (
            mbedtls_pk_can_do_ext(cur->key, pk_alg, pk_usage));
#endif /* MBEDTLS_SSL_ASYNC_PRIVATE */
#else
        key_type_matches = mbedtls_pk_can_do(&cur->cert->pk, pk_alg);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
        if (!key_type_matches) {
            MBEDTLS_SSL_DEBUG_MSG(3, ("certificate mismatch: key type"));
            continue;
        }

        /*
         * This avoids sending the client a cert it'll reject based on
         * keyUsage or other extensions.
         *
         * It also allows the user to provision different certificates for
         * different uses based on keyUsage, eg if they want to avoid signing
         * and decrypting with the same RSA key.
         */
        if (mbedtls_ssl_check_cert_usage(cur->cert, ciphersuite_info,
                                         MBEDTLS_SSL_IS_SERVER, &flags) != 0) {
            MBEDTLS_SSL_DEBUG_MSG(3, ("certificate mismatch: "
                                      "(extended) key usage extension"));
            continue;
        }

#if defined(MBEDTLS_KEY_EXCHANGE_ECDSA_CERT_REQ_ALLOWED_ENABLED)
        if (pk_alg == MBEDTLS_PK_ECDSA &&
            ssl_check_key_curve(&cur->cert->pk,
                                ssl->handshake->curves_tls_id) != 0) {
            MBEDTLS_SSL_DEBUG_MSG(3, ("certificate mismatch: elliptic curve"));
            continue;
        }
#endif

        /* If we get there, we got a winner */
        break;
    }

    /* Do not update ssl->handshake->key_cert unless there is a match */
    if (cur != NULL) {
        ssl->handshake->key_cert = cur;
        MBEDTLS_SSL_DEBUG_CRT(3, "selected certificate chain, certificate",
                              ssl->handshake->key_cert->cert);
        return 0;
    }

    return -1;
}